

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void init_vertices(void)

{
  int iVar1;
  int local_10;
  int p;
  int y;
  int x;
  
  for (local_10 = 0; local_10 < 0x32; local_10 = local_10 + 1) {
    for (p = 0; p < 0x32; p = p + 1) {
      iVar1 = local_10 * 0x32 + p;
      vertex[iVar1].x = (float)(p + -0x19) / 25.0;
      vertex[iVar1].y = (float)(local_10 + -0x19) / 25.0;
      vertex[iVar1].z = 0.0;
      if (p % 4 < 2 == local_10 % 4 < 2) {
        vertex[iVar1].r = 1.0;
      }
      else {
        vertex[iVar1].r = 0.0;
      }
      vertex[iVar1].g = (float)local_10 / 50.0;
      vertex[iVar1].b = 1.0 - ((float)p / 50.0 + (float)local_10 / 50.0) / 2.0;
    }
  }
  for (local_10 = 0; local_10 < 0x31; local_10 = local_10 + 1) {
    for (p = 0; p < 0x31; p = p + 1) {
      iVar1 = (local_10 * 0x31 + p) * 4;
      quad[iVar1] = local_10 * 0x32 + p;
      quad[iVar1 + 1] = local_10 * 0x32 + p + 1;
      quad[iVar1 + 2] = (local_10 + 1) * 0x32 + p + 1;
      quad[iVar1 + 3] = (local_10 + 1) * 0x32 + p;
    }
  }
  return;
}

Assistant:

void init_vertices(void)
{
    int x, y, p;

    // Place the vertices in a grid
    for (y = 0;  y < GRIDH;  y++)
    {
        for (x = 0;  x < GRIDW;  x++)
        {
            p = y * GRIDW + x;

            vertex[p].x = (GLfloat) (x - GRIDW / 2) / (GLfloat) (GRIDW / 2);
            vertex[p].y = (GLfloat) (y - GRIDH / 2) / (GLfloat) (GRIDH / 2);
            vertex[p].z = 0;

            if ((x % 4 < 2) ^ (y % 4 < 2))
                vertex[p].r = 0.0;
            else
                vertex[p].r = 1.0;

            vertex[p].g = (GLfloat) y / (GLfloat) GRIDH;
            vertex[p].b = 1.f - ((GLfloat) x / (GLfloat) GRIDW + (GLfloat) y / (GLfloat) GRIDH) / 2.f;
        }
    }

    for (y = 0;  y < QUADH;  y++)
    {
        for (x = 0;  x < QUADW;  x++)
        {
            p = 4 * (y * QUADW + x);

            quad[p + 0] = y       * GRIDW + x;     // Some point
            quad[p + 1] = y       * GRIDW + x + 1; // Neighbor at the right side
            quad[p + 2] = (y + 1) * GRIDW + x + 1; // Upper right neighbor
            quad[p + 3] = (y + 1) * GRIDW + x;     // Upper neighbor
        }
    }
}